

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgregoriancalendar.cpp
# Opt level: O2

int QGregorianCalendar::yearSharingWeekDays(QDate date)

{
  uint uVar1;
  bool bVar2;
  uint year;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int *piVar7;
  long in_FS_OFFSET;
  QDate local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  year = QDate::year(&local_28);
  if ((int)year < 0x7b2) {
    uVar6 = 0x960 - ((((int)year >> 0x1f) - year) + 2000) % 400;
  }
  else {
    uVar3 = year;
    if (year < 0x960) goto LAB_00313327;
    uVar6 = (year - 2000) % 400 + 2000;
  }
  uVar3 = 0x960;
  if (uVar6 != year) {
    uVar1 = (uVar6 & 0xffff) % 100;
    uVar3 = QDate::month(&local_28);
    if ((uVar3 == uVar1) || (uVar4 = QDate::day(&local_28), uVar3 = uVar6, uVar4 == uVar1)) {
      bVar2 = leapTest(year);
      piVar7 = yearSharingWeekDays::usual;
      if (bVar2) {
        piVar7 = yearSharingWeekDays::leaps;
      }
      iVar5 = yearStartWeekDay(year);
      uVar3 = piVar7[(long)iVar5 + -1];
    }
  }
LAB_00313327:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return uVar3;
}

Assistant:

int QGregorianCalendar::yearSharingWeekDays(QDate date)
{
    // Returns a post-epoch year, no later than 2400, that has the same pattern
    // of week-days (in the proleptic Gregorian calendar) as the year in which
    // the given date falls. This will be the year in question if it's in the
    // given range. Otherwise, the returned year's last two (decimal) digits
    // won't coincide with the month number or day-of-month of the given date.
    // For positive years, except when necessary to avoid such a clash, the
    // returned year's last two digits shall coincide with those of the original
    // year.

    // Needed when formatting dates using system APIs with limited year ranges
    // and possibly only a two-digit year. (The need to be able to safely
    // replace the two-digit form of the returned year with a suitable form of
    // the true year, when they don't coincide, is why the last two digits are
    // treated specially.)

    static_assert((400 * 365 + 97) % 7 == 0);
    // A full 400-year cycle of the Gregorian calendar has 97 + 400 * 365 days;
    // as 365 is one more than a multiple of seven and 497 is a multiple of
    // seven, that full cycle is a whole number of weeks. So adding a multiple
    // of four hundred years should get us a result that meets our needs.

    const int year = date.year();
    int res = (year < 1970
               ? 2400 - (2000 - (year < 0 ? year + 1 : year)) % 400
               : year > 2399 ? 2000 + (year - 2000) % 400 : year);
    Q_ASSERT(res > 0);
    if (res != year) {
        const int lastTwo = res % 100;
        if (lastTwo == date.month() || lastTwo == date.day()) {
            Q_ASSERT(lastTwo && !(lastTwo & ~31));
            // Last two digits of these years are all > 31:
            static constexpr int usual[] = { 2198, 2199, 2098, 2099, 2399, 2298, 2299 };
            static constexpr int leaps[] = { 2396, 2284, 2296, 2184, 2196, 2084, 2096 };
            // Indexing is: first day of year's day-of-week, Monday = 0, one less
            // than Qt's, as it's simpler to subtract one than to s/7/0/.
            res = (leapTest(year) ? leaps : usual)[yearStartWeekDay(year) - 1];
        }
        Q_ASSERT(QDate(res, 1, 1).dayOfWeek() == QDate(year, 1, 1).dayOfWeek());
        Q_ASSERT(QDate(res, 12, 31).dayOfWeek() == QDate(year, 12, 31).dayOfWeek());
    }
    Q_ASSERT(res >= 1970 && res <= 2400);
    return res;
}